

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidyParseString(TidyDoc tdoc,ctmbstr content)

{
  uint uVar1;
  int iVar2;
  StreamIn *in;
  TidyBuffer inbuf;
  
  if (content == (ctmbstr)0x0) {
    iVar2 = -0x16;
  }
  else {
    tidyBufInitWithAllocator(&inbuf,*(TidyAllocator **)(tdoc + 0xd18));
    uVar1 = prvTidytmbstrlen(content);
    tidyBufAttach(&inbuf,(byte *)content,uVar1 + 1);
    in = prvTidyBufferInput((TidyDocImpl *)tdoc,&inbuf,tdoc[0x60]._opaque);
    iVar2 = prvTidyDocParseStream((TidyDocImpl *)tdoc,in);
    tidyBufDetach(&inbuf);
    prvTidyfreeStreamIn(in);
  }
  return iVar2;
}

Assistant:

int   tidyDocParseString( TidyDocImpl* doc, ctmbstr content )
{
    int status = -EINVAL;
    TidyBuffer inbuf;
    StreamIn* in = NULL;

    if ( content )
    {
        tidyBufInitWithAllocator( &inbuf, doc->allocator );
        tidyBufAttach( &inbuf, (byte*)content, TY_(tmbstrlen)(content)+1 );
        in = TY_(BufferInput)( doc, &inbuf, cfg( doc, TidyInCharEncoding ));
        status = TY_(DocParseStream)( doc, in );
        tidyBufDetach( &inbuf );
        TY_(freeStreamIn)(in);
    }
    return status;
}